

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O0

void llvm::yaml::MappingTraits<llvm::DWARFYAML::FormValue>::mapping(IO *IO,FormValue *FormValue)

{
  bool bVar1;
  uint uVar2;
  FormValue *FormValue_local;
  IO *IO_local;
  
  yaml::IO::mapOptional<llvm::yaml::Hex64>(IO,"Value",&FormValue->Value);
  bVar1 = StringRef::empty(&FormValue->CStr);
  if ((!bVar1) || (uVar2 = (*IO->_vptr_IO[2])(), (uVar2 & 1) == 0)) {
    yaml::IO::mapOptional<llvm::StringRef>(IO,"CStr",&FormValue->CStr);
  }
  bVar1 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::empty
                    (&FormValue->BlockData);
  if ((!bVar1) || (uVar2 = (*IO->_vptr_IO[2])(), (uVar2 & 1) == 0)) {
    yaml::IO::mapOptional<std::vector<llvm::yaml::Hex8,std::allocator<llvm::yaml::Hex8>>>
              (IO,"BlockData",&FormValue->BlockData);
  }
  return;
}

Assistant:

void MappingTraits<DWARFYAML::FormValue>::mapping(
    IO &IO, DWARFYAML::FormValue &FormValue) {
  IO.mapOptional("Value", FormValue.Value);
  if (!FormValue.CStr.empty() || !IO.outputting())
    IO.mapOptional("CStr", FormValue.CStr);
  if (!FormValue.BlockData.empty() || !IO.outputting())
    IO.mapOptional("BlockData", FormValue.BlockData);
}